

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O3

void __thiscall
agge::tests::GenericRGBXBlenderTests::AlphaIsMixedFromSrcAlphaAndCover
          (GenericRGBXBlenderTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  color cVar3;
  color cVar4;
  FailedAssertion *pFVar5;
  long lVar6;
  int iVar7;
  pixel dest2 [4];
  pixel dest1 [4];
  uint8_t covers [4];
  byte local_c8 [44];
  byte local_9c [4];
  string local_98;
  string local_78;
  LocationInfo local_58;
  
  local_9c[0] = 0x10;
  local_9c[1] = 0x90;
  local_9c[2] = 0xa0;
  local_9c[3] = 0xd0;
  cVar3 = color::make(0x80,0x80,0x80,'0');
  cVar4 = color::make(0x80,0x80,0x80,0xc0);
  local_c8[0x10] = 0x20;
  local_c8[0x11] = 0x80;
  local_c8[0x12] = 0xe0;
  local_c8[0x13] = 0x80;
  local_c8[0x14] = 0x20;
  local_c8[0x15] = 0x80;
  local_c8[0x16] = 0xe0;
  local_c8[0x17] = 0x80;
  local_c8[0x18] = 0x20;
  local_c8[0x19] = 0x80;
  local_c8[0x1a] = 0xe0;
  local_c8[0x1b] = 0x80;
  local_c8[0x1c] = 0x20;
  local_c8[0x1d] = 0x80;
  local_c8[0x1e] = 0xe0;
  local_c8[0x1f] = 0x80;
  local_c8[0] = 0x20;
  local_c8[1] = 0x80;
  local_c8[2] = 0xe0;
  local_c8[3] = 0x80;
  local_c8[4] = 0x20;
  local_c8[5] = 0x80;
  local_c8[6] = 0xe0;
  local_c8[7] = 0x80;
  local_c8[8] = 0x20;
  local_c8[9] = 0x80;
  local_c8[10] = 0xe0;
  local_c8[0xb] = 0x80;
  local_c8[0xc] = 0x20;
  local_c8[0xd] = 0x80;
  local_c8[0xe] = 0xe0;
  local_c8[0xf] = 0x80;
  lVar6 = 0;
  do {
    iVar7 = (uint)local_9c[lVar6] *
            (((uint)cVar3 >> 0x18) * 0x40 + (((uint)cVar3 >> 0x18) * 0x1f9) / 1000);
    if (iVar7 == 0x3fffc0) {
      local_c8[lVar6 * 4 + 0x10] = cVar3.r;
      local_c8[lVar6 * 4 + 0x11] = cVar3.g;
      local_c8[lVar6 * 4 + 0x12] = cVar3.b;
    }
    else {
      local_c8[lVar6 * 4 + 0x10] =
           (char)((((uint)cVar3 & 0xff) - (uint)local_c8[lVar6 * 4 + 0x10]) * iVar7 >> 0x16) +
           local_c8[lVar6 * 4 + 0x10];
      local_c8[lVar6 * 4 + 0x11] =
           (char)((((uint)cVar3 >> 8 & 0xff) - (uint)local_c8[lVar6 * 4 + 0x11]) * iVar7 >> 0x16) +
           local_c8[lVar6 * 4 + 0x11];
      local_c8[lVar6 * 4 + 0x12] =
           (char)((((uint)cVar3 >> 0x10 & 0xff) - (uint)local_c8[lVar6 * 4 + 0x12]) * iVar7 >> 0x16)
           + local_c8[lVar6 * 4 + 0x12];
    }
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  lVar6 = 0;
  do {
    iVar7 = (uint)local_9c[lVar6] *
            ((((uint)cVar4 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar4 >> 0x18) * 0x40);
    if (iVar7 == 0x3fffc0) {
      local_c8[lVar6 * 4] = cVar4.r;
      local_c8[lVar6 * 4 + 1] = cVar4.g;
      local_c8[lVar6 * 4 + 2] = cVar4.b;
    }
    else {
      local_c8[lVar6 * 4] =
           (char)((((uint)cVar4 & 0xff) - (uint)local_c8[lVar6 * 4]) * iVar7 >> 0x16) +
           local_c8[lVar6 * 4];
      local_c8[lVar6 * 4 + 1] =
           (char)((((uint)cVar4 >> 8 & 0xff) - (uint)local_c8[lVar6 * 4 + 1]) * iVar7 >> 0x16) +
           local_c8[lVar6 * 4 + 1];
      local_c8[lVar6 * 4 + 2] =
           (char)((((uint)cVar4 >> 0x10 & 0xff) - (uint)local_c8[lVar6 * 4 + 2]) * iVar7 >> 0x16) +
           local_c8[lVar6 * 4 + 2];
    }
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0xee);
  lVar6 = 0;
  while( true ) {
    if ((((&DAT_0019f290)[lVar6] != local_c8[lVar6 + 0x10]) ||
        ((&DAT_0019f291)[lVar6] != local_c8[lVar6 + 0x11])) ||
       ((&DAT_0019f292)[lVar6] != local_c8[lVar6 + 0x12])) break;
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x10) {
      paVar2 = &local_58.filename.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_58.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_58,&local_98,0xef);
      lVar6 = 0;
      while( true ) {
        if ((((&DAT_0019f2a0)[lVar6] != local_c8[lVar6]) ||
            ((&DAT_0019f2a1)[lVar6] != local_c8[lVar6 + 1])) ||
           ((&DAT_0019f2a2)[lVar6] != local_c8[lVar6 + 2])) break;
        lVar6 = lVar6 + 4;
        if (lVar6 == 0x10) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.filename._M_dataplus._M_p != paVar2) {
            operator_delete(local_58.filename._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          return;
        }
      }
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,&local_78,&local_58);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
  }
  pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(pFVar5,&local_78,&local_58);
  __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( AlphaIsMixedFromSrcAlphaAndCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 4;
				const pixel back = { { 0x20, 0x80, 0xE0, 0x80 } };
				const uint8_t covers[n] = { 0x10, 0x90, 0xA0, 0xD0, };
				blender_solid_color_rgb<pixel, order_rgba> b1(color::make(0x80, 0x80, 0x80, 0x30));
				blender_solid_color_rgb<pixel, order_rgba> b2(color::make(0x80, 0x80, 0x80, 0xC0));
				pixel dest1[n];
				pixel dest2[n];

				fill_n(dest1, n, back);
				fill_n(dest2, n, back);

				// ACT
				b1(dest1, 0, 0, n, covers);
				b2(dest2, 0, 0, n, covers);

				// ASSERT
				pixel reference1[] = {
					{ { 0x21, 0x80, 0xDE, } },
					{ { 0x2A, 0x80, 0xD5, } },
					{ { 0x2B, 0x80, 0xD4, } },
					{ { 0x2E, 0x80, 0xD1, } },
				};
				pixel reference2[] = {
					{ { 0x24, 0x80, 0xDB, } },
					{ { 0x48, 0x80, 0xB7, } },
					{ { 0x4D, 0x80, 0xB2, } },
					{ { 0x5A, 0x80, 0xA5, } },
				};

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}